

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadScript
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    if (text[uVar2] == '\0') {
      return uVar2;
    }
    uVar1 = ReadWhitespace(text + uVar2);
    if ((int)uVar1 < 1) {
      uVar1 = ReadInstruction(text + uVar2,instrl,errorType);
      if ((int)uVar1 < 1) {
        if (uVar1 != 0) {
          return uVar1 - uVar2;
        }
        *errorType = SCRPT_ERROR_UNKNOW;
        return -uVar2;
      }
    }
    uVar2 = uVar2 + uVar1;
  } while( true );
}

Assistant:

int LiteScript::Syntax::ReadScript(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    int i = 0, tmp;
    while (text[i] != '\0'){
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
            i += tmp;
        else {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                return -i;
            }
        }
    }
    return i;
}